

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::reset_parameters(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
                   *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = ((this->traits_).range + 0x20) / 0x40;
  if (iVar1 < 3) {
    iVar1 = 2;
  }
  for (lVar3 = 0xb4; lVar3 != 0x1784; lVar3 = lVar3 + 0x10) {
    *(int *)((long)this + lVar3 + -0xc) = iVar1;
    *(undefined8 *)((long)this + lVar3 + -8) = 0;
    *(undefined4 *)((long)&(this->super_decoder_strategy)._vptr_decoder_strategy + lVar3) = 1;
  }
  iVar2 = ((this->traits_).range + 0x20) / 0x40;
  iVar1 = 2;
  if (2 < iVar2) {
    iVar1 = iVar2;
  }
  (this->context_run_mode_)._M_elems[0].run_interruption_type_ = 0;
  (this->context_run_mode_)._M_elems[0].a_ = iVar1;
  (this->context_run_mode_)._M_elems[0].n_ = '\x01';
  (this->context_run_mode_)._M_elems[0].nn_ = '\0';
  (this->context_run_mode_)._M_elems[1].run_interruption_type_ = 1;
  (this->context_run_mode_)._M_elems[1].a_ = iVar1;
  (this->context_run_mode_)._M_elems[1].n_ = '\x01';
  (this->context_run_mode_)._M_elems[1].nn_ = '\0';
  this->run_index_ = 0;
  return;
}

Assistant:

void reset_parameters() noexcept
    {
        const context_regular_mode context_initial_value(traits_.range);
        for (auto& context : contexts_)
        {
            context = context_initial_value;
        }

        context_run_mode_[0] = context_run_mode(0, traits_.range);
        context_run_mode_[1] = context_run_mode(1, traits_.range);
        run_index_ = 0;
    }